

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall FlowGraph::RemoveUnreachableBlocks(FlowGraph *this)

{
  undefined1 *puVar1;
  BasicBlock *pBVar2;
  code *pcVar3;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar4;
  bool bVar5;
  undefined4 *puVar6;
  BasicBlock *pBVar7;
  Type *ppFVar8;
  undefined1 local_40 [8];
  Iterator __iter;
  
  if (this->blockList == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x963,"(this->blockList)","this->blockList");
    if (!bVar5) {
LAB_00416f07:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  for (pBVar7 = this->blockList; pBVar7 != (BasicBlock *)0x0; pBVar7 = pBVar7->next) {
    if ((*(ushort *)&pBVar7->field_0x18 & 1) == 0) {
      *(ushort *)&pBVar7->field_0x18 = *(ushort *)&pBVar7->field_0x18 & 0xffde;
    }
  }
  puVar1 = &this->blockList->field_0x18;
  *(ushort *)puVar1 = *(ushort *)puVar1 | 0x20;
  pBVar7 = this->blockList;
  if (pBVar7 != (BasicBlock *)0x0) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      pBVar2 = pBVar7->next;
      pSVar4 = __iter.list;
      if ((*(ushort *)&pBVar7->field_0x18 & 1) == 0) {
        if ((*(ushort *)&pBVar7->field_0x18 & 0x20) == 0) {
          RemoveBlock(this,pBVar7,(GlobOpt *)0x0,false);
          pSVar4 = __iter.list;
        }
        else {
          local_40 = (undefined1  [8])&pBVar7->succList;
          __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40;
          while( true ) {
            if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar6 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                 ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar5) goto LAB_00416f07;
              *puVar6 = 0;
            }
            __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                          ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            pSVar4 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
            if ((undefined1  [8])__iter.list == local_40) break;
            ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                ((Iterator *)local_40);
            pBVar7 = (*ppFVar8)->succBlock;
            if (pBVar7 == (BasicBlock *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar6 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                 ,0x971,"(succ)","succ");
              if (!bVar5) goto LAB_00416f07;
              *puVar6 = 0;
            }
            puVar1 = &pBVar7->field_0x18;
            *puVar1 = *puVar1 | 0x20;
          }
        }
      }
      __iter.list = pSVar4;
      pBVar7 = pBVar2;
    } while (pBVar2 != (BasicBlock *)0x0);
  }
  return;
}

Assistant:

void
FlowGraph::RemoveUnreachableBlocks()
{
    AnalysisAssert(this->blockList);

    FOREACH_BLOCK(block, this)
    {
        block->isVisited = false;
    }
    NEXT_BLOCK;

    this->blockList->isVisited = true;

    FOREACH_BLOCK_EDITING(block, this)
    {
        if (block->isVisited)
        {
            FOREACH_SUCCESSOR_BLOCK(succ, block)
            {
                succ->isVisited = true;
            } NEXT_SUCCESSOR_BLOCK;
        }
        else
        {
            this->RemoveBlock(block);
        }
    }
    NEXT_BLOCK_EDITING;
}